

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> * __thiscall
mpt::reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_>::operator=
          (reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *this,
          reference<mpt::content<mpt::item<mpt::layout::graph::axis>_>_> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  content<mpt::item<mpt::layout::graph::axis>_> *pcVar2;
  content<mpt::item<mpt::layout::graph::axis>_> *pcVar3;
  
  pcVar3 = ref->_ref;
  pcVar2 = this->_ref;
  if (pcVar3 != pcVar2) {
    if (pcVar3 == (content<mpt::item<mpt::layout::graph::axis>_> *)0x0) {
      pcVar3 = (content<mpt::item<mpt::layout::graph::axis>_> *)0x0;
    }
    else {
      iVar1 = (*(pcVar3->super_buffer)._vptr_buffer[2])(pcVar3);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pcVar3 = (content<mpt::item<mpt::layout::graph::axis>_> *)0x0;
      }
      pcVar2 = this->_ref;
    }
    if (pcVar2 != (content<mpt::item<mpt::layout::graph::axis>_> *)0x0) {
      (*(pcVar2->super_buffer)._vptr_buffer[1])();
    }
    this->_ref = pcVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}